

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

char * nullcGetArgumentVector(uint functionID,uintptr_t extra,__va_list_tag *args)

{
  uintptr_t uVar1;
  int iVar2;
  float *pfVar3;
  uintptr_t *puVar4;
  double *pdVar5;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  char *__function;
  long lVar9;
  uint uVar10;
  float *pfVar11;
  long lVar12;
  long lVar13;
  
  if (*(uint *)(NULLC::linker + 0x24c) <= functionID) {
    __function = 
    "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
LAB_0010e664:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x7f,__function);
  }
  pfVar11 = NULLC::argBuf;
  if (*(int *)(*(long *)(NULLC::linker + 0x240) + 0x54 + (ulong)functionID * 0x94) == 0) {
LAB_0010e607:
    *(uintptr_t *)pfVar11 = extra;
    return (char *)NULLC::argBuf;
  }
  lVar12 = *(long *)(NULLC::linker + 0x240) + (ulong)functionID * 0x94;
  uVar10 = 0;
LAB_0010e232:
  uVar7 = *(int *)(lVar12 + 0x50) + uVar10;
  if (*(uint *)(NULLC::linker + 0x27c) <= uVar7) {
    __function = 
    "T &FastVector<ExternLocalInfo>::operator[](unsigned int) [T = ExternLocalInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
    goto LAB_0010e664;
  }
  uVar7 = *(uint *)(*(long *)(NULLC::linker + 0x270) + 4 + (ulong)uVar7 * 0x1c);
  if (*(uint *)(NULLC::linker + 0x20c) <= uVar7) {
LAB_0010e638:
    __function = 
    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
    goto LAB_0010e664;
  }
  lVar9 = *(long *)(NULLC::linker + 0x200);
  lVar13 = (ulong)uVar7 * 0x50;
  switch(*(undefined4 *)(lVar9 + 0xc + lVar13)) {
  case 0:
    if ((nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::autoRefHash == '\0') &&
       (iVar2 = __cxa_guard_acquire(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)
                                     ::autoRefHash), iVar2 != 0)) {
      nullcGetArgumentVector::autoRefHash = NULLC::GetStringHash("auto ref");
      __cxa_guard_release(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::
                           autoRefHash);
    }
    if ((nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::autoArrayHash == '\0')
       && (iVar2 = __cxa_guard_acquire(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)
                                        ::autoArrayHash), iVar2 != 0)) {
      nullcGetArgumentVector::autoArrayHash = NULLC::GetStringHash("auto[]");
      __cxa_guard_release(&nullcGetArgumentVector(unsigned_int,unsigned_long,__va_list_tag*)::
                           autoArrayHash);
    }
    lVar9 = lVar9 + lVar13;
    iVar2 = *(int *)(lVar9 + 0x10);
    if ((iVar2 == 3) || (*(int *)(lVar9 + 0x18) == -1 && iVar2 == 1)) {
      uVar7 = args->gp_offset;
      if (0x20 < (ulong)uVar7) goto LAB_0010e3e9;
      puVar4 = (uintptr_t *)((ulong)uVar7 + (long)args->reg_save_area);
      args->gp_offset = uVar7 + 0x10;
    }
    else {
      if (*(uint *)(lVar9 + 0x28) != nullcGetArgumentVector::autoRefHash) {
        if (*(uint *)(lVar9 + 0x28) != nullcGetArgumentVector::autoArrayHash) {
          if (iVar2 != 4) {
switchD_0010e4ae_default:
            NULLC::nullcLastError = "ERROR: unsupported complex function parameter";
            return (char *)0x0;
          }
          if (*(uint *)(lVar9 + 0x24) < *(uint *)(NULLC::linker + 0x21c)) {
            if (*(int *)(lVar9 + 0x18) != 0) {
              puVar6 = (uint *)((ulong)*(uint *)(lVar9 + 0x24) * 0xc +
                               *(long *)(NULLC::linker + 0x210));
              uVar8 = 0;
              do {
                if (*(uint *)(NULLC::linker + 0x20c) <= *puVar6) goto LAB_0010e638;
                switch(*(undefined4 *)
                        (*(long *)(NULLC::linker + 0x200) + 0xc + (ulong)*puVar6 * 0x50)) {
                case 2:
                case 6:
                case 7:
                  uVar7 = args->gp_offset;
                  if ((ulong)uVar7 < 0x29) {
                    pfVar3 = (float *)((ulong)uVar7 + (long)args->reg_save_area);
                    args->gp_offset = uVar7 + 8;
                  }
                  else {
                    pfVar3 = (float *)args->overflow_arg_area;
                    args->overflow_arg_area = pfVar3 + 2;
                  }
                  *pfVar11 = *pfVar3;
                  break;
                case 3:
                  uVar7 = args->fp_offset;
                  if ((ulong)uVar7 < 0xa1) {
                    pdVar5 = (double *)((ulong)uVar7 + (long)args->reg_save_area);
                    args->fp_offset = uVar7 + 0x10;
                  }
                  else {
                    pdVar5 = (double *)args->overflow_arg_area;
                    args->overflow_arg_area = pdVar5 + 1;
                  }
                  *pfVar11 = (float)*pdVar5;
                  break;
                case 4:
                  uVar7 = args->gp_offset;
                  if ((ulong)uVar7 < 0x29) {
                    puVar4 = (uintptr_t *)((ulong)uVar7 + (long)args->reg_save_area);
                    args->gp_offset = uVar7 + 8;
                  }
                  else {
                    puVar4 = (uintptr_t *)args->overflow_arg_area;
                    args->overflow_arg_area = puVar4 + 1;
                  }
                  *(uintptr_t *)pfVar11 = *puVar4;
                  goto LAB_0010e579;
                case 5:
                  uVar7 = args->fp_offset;
                  if ((ulong)uVar7 < 0xa1) {
                    puVar4 = (uintptr_t *)((ulong)uVar7 + (long)args->reg_save_area);
                    args->fp_offset = uVar7 + 0x10;
                  }
                  else {
                    puVar4 = (uintptr_t *)args->overflow_arg_area;
                    args->overflow_arg_area = puVar4 + 1;
                  }
                  *(uintptr_t *)pfVar11 = *puVar4;
LAB_0010e579:
                  lVar13 = 8;
                  goto LAB_0010e57e;
                default:
                  goto switchD_0010e4ae_default;
                }
                lVar13 = 4;
LAB_0010e57e:
                pfVar11 = (float *)((long)pfVar11 + lVar13);
                uVar8 = uVar8 + 1;
                puVar6 = puVar6 + 3;
              } while (uVar8 < *(uint *)(lVar9 + 0x18));
            }
            break;
          }
          __function = 
          "T &FastVector<ExternMemberInfo>::operator[](unsigned int) [T = ExternMemberInfo, zeroNewMemory = false, skipConstructor = false]"
          ;
          goto LAB_0010e664;
        }
        puVar4 = (uintptr_t *)args->overflow_arg_area;
        args->overflow_arg_area = puVar4 + 2;
        uVar1 = puVar4[1];
        *(uintptr_t *)pfVar11 = *puVar4;
        *(uintptr_t *)(pfVar11 + 2) = uVar1;
        pfVar11 = pfVar11 + 4;
        break;
      }
LAB_0010e3e9:
      puVar4 = (uintptr_t *)args->overflow_arg_area;
      args->overflow_arg_area = puVar4 + 2;
    }
    uVar1 = *puVar4;
    pfVar11[2] = *(float *)(puVar4 + 1);
    *(uintptr_t *)pfVar11 = uVar1;
    pfVar11 = pfVar11 + 3;
    break;
  case 2:
  case 6:
  case 7:
    uVar7 = args->gp_offset;
    if ((ulong)uVar7 < 0x29) {
      pfVar3 = (float *)((ulong)uVar7 + (long)args->reg_save_area);
      args->gp_offset = uVar7 + 8;
    }
    else {
      pfVar3 = (float *)args->overflow_arg_area;
      args->overflow_arg_area = pfVar3 + 2;
    }
    *pfVar11 = *pfVar3;
    goto LAB_0010e423;
  case 3:
    uVar7 = args->fp_offset;
    if ((ulong)uVar7 < 0xa1) {
      pdVar5 = (double *)((ulong)uVar7 + (long)args->reg_save_area);
      args->fp_offset = uVar7 + 0x10;
    }
    else {
      pdVar5 = (double *)args->overflow_arg_area;
      args->overflow_arg_area = pdVar5 + 1;
    }
    *pfVar11 = (float)*pdVar5;
LAB_0010e423:
    pfVar11 = pfVar11 + 1;
    break;
  case 4:
    uVar7 = args->gp_offset;
    if ((ulong)uVar7 < 0x29) {
      puVar4 = (uintptr_t *)((ulong)uVar7 + (long)args->reg_save_area);
      args->gp_offset = uVar7 + 8;
    }
    else {
      puVar4 = (uintptr_t *)args->overflow_arg_area;
      args->overflow_arg_area = puVar4 + 1;
    }
    *(uintptr_t *)pfVar11 = *puVar4;
    goto LAB_0010e3e3;
  case 5:
    uVar7 = args->fp_offset;
    if ((ulong)uVar7 < 0xa1) {
      puVar4 = (uintptr_t *)((ulong)uVar7 + (long)args->reg_save_area);
      args->fp_offset = uVar7 + 0x10;
    }
    else {
      puVar4 = (uintptr_t *)args->overflow_arg_area;
      args->overflow_arg_area = puVar4 + 1;
    }
    *(uintptr_t *)pfVar11 = *puVar4;
LAB_0010e3e3:
    pfVar11 = pfVar11 + 2;
  }
  uVar10 = uVar10 + 1;
  if (*(uint *)(lVar12 + 0x54) <= uVar10) goto LAB_0010e607;
  goto LAB_0010e232;
}

Assistant:

const char*	nullcGetArgumentVector(unsigned functionID, uintptr_t extra, va_list args)
{
	using namespace NULLC;

	// Copy arguments in argument buffer
	ExternFuncInfo	&func = linker->exFunctions[functionID];
	char *argPos = argBuf;
	for(unsigned i = 0; i < func.paramCount; i++)
	{
		ExternLocalInfo &lInfo = linker->exLocals[func.offsetToFirstLocal + i];
		ExternTypeInfo &tInfo = linker->exTypes[lInfo.type];
		switch(tInfo.type)
		{
		case ExternTypeInfo::TYPE_VOID:
			break;
		case ExternTypeInfo::TYPE_CHAR:
		case ExternTypeInfo::TYPE_SHORT:
		case ExternTypeInfo::TYPE_INT:
			*(int*)argPos = va_arg(args, int);
			argPos += 4;
			break;
		case ExternTypeInfo::TYPE_LONG:
			*(long long*)argPos = va_arg(args, long long);
			argPos += 8;
			break;
		case ExternTypeInfo::TYPE_FLOAT:
			*(float*)argPos = (float)va_arg(args, double);
			argPos += 4;
			break;
		case ExternTypeInfo::TYPE_DOUBLE:
			*(double*)argPos = va_arg(args, double);
			argPos += 8;
			break;
		case ExternTypeInfo::TYPE_COMPLEX:
			static unsigned autoRefHash = GetStringHash("auto ref");
			static unsigned autoArrayHash = GetStringHash("auto[]");
#ifdef _WIN64
			if(tInfo.size <= 4)
				*(int*)argPos = va_arg(args, int);
			else if(tInfo.size <= 8)
				*(long long*)argPos = va_arg(args, long long);
			else
				memcpy(argPos, va_arg(args, char*), tInfo.size);
			argPos += tInfo.size;
#elif defined(__aarch64__)
			if(tInfo.size <= 4)
			{
				*(int*)argPos = va_arg(args, int);
			}
			else if(tInfo.size <= 8)
			{
				*(long long*)argPos = va_arg(args, long long);
			}
			else if(tInfo.size <= 12)
			{
				*(long long*)argPos = va_arg(args, long long);
				*(long long*)(argPos + 8) = va_arg(args, long long);
			}
			else if(tInfo.size <= 16)
			{
				*(long long*)argPos = va_arg(args, long long);
				*(long long*)(argPos + 8) = va_arg(args, long long);
			}
			else
			{
				memcpy(argPos, va_arg(args, char*), tInfo.size);
			}
			argPos += tInfo.size;
#elif defined(__x86_64__)
			if((tInfo.subCat == ExternTypeInfo::CAT_ARRAY && tInfo.arrSize == ~0u) || tInfo.subCat == ExternTypeInfo::CAT_FUNCTION)
			{
				*(NULLCArray*)argPos = va_arg(args, NULLCArray);
				argPos += 12;
			}else if(tInfo.nameHash == autoRefHash){
				*(NULLCRef*)argPos = va_arg(args, NULLCRef);
				argPos += 12;
			}else if(tInfo.nameHash == autoArrayHash){
				*(NULLCAutoArray*)argPos = va_arg(args, NULLCAutoArray);
				argPos += sizeof(NULLCAutoArray);
			}else if(tInfo.subCat == ExternTypeInfo::CAT_CLASS){
				ExternMemberInfo *memberList = &linker->exTypeExtra[tInfo.memberOffset];
				for(unsigned k = 0; k < tInfo.memberCount; k++)
				{
					const ExternTypeInfo &subType = linker->exTypes[memberList[k].type];
					switch(subType.type)
					{
					case ExternTypeInfo::TYPE_CHAR:
					case ExternTypeInfo::TYPE_SHORT:
					case ExternTypeInfo::TYPE_INT:
						*(int*)argPos = va_arg(args, int);
						argPos += 4;
						break;
					case ExternTypeInfo::TYPE_LONG:
						*(long long*)argPos = va_arg(args, long long);
						argPos += 8;
						break;
					case ExternTypeInfo::TYPE_FLOAT:
						*(float*)argPos = (float)va_arg(args, double);
						argPos += 4;
						break;
					case ExternTypeInfo::TYPE_DOUBLE:
						*(double*)argPos = va_arg(args, double);
						argPos += 8;
						break;
					default:
						nullcLastError = "ERROR: unsupported complex function parameter";
						return NULL;
					}
				}
			}else{
				nullcLastError = "ERROR: unsupported complex function parameter";
				return NULL;
			}
#else
			for(unsigned u = 0; u < tInfo.size >> 2; u++, argPos += 4)
				*(int*)argPos = va_arg(args, int);
#endif
			break;
		}
	}

	memcpy(argPos, &extra, sizeof(extra));
	argPos += sizeof(uintptr_t);

	return argBuf;
}